

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionProxy::HasValidEntryPoint(FunctionProxy *this)

{
  bool bVar1;
  
  bVar1 = IsWasmFunction(this);
  if ((!bVar1) &&
     ((this->m_scriptContext->hadProfiled != false ||
      ((bVar1 = ScriptContext::IsScriptContextInDebugMode(this->m_scriptContext), bVar1 &&
       (bVar1 = ScriptContext::IsExceptionWrapperForBuiltInsEnabled(this->m_scriptContext), bVar1)))
      ))) {
    bVar1 = HasValidNonProfileEntryPoint(this);
    if (!bVar1) {
      bVar1 = HasValidProfileEntryPoint(this);
      return bVar1;
    }
    return true;
  }
  bVar1 = HasValidNonProfileEntryPoint(this);
  return bVar1;
}

Assistant:

bool FunctionProxy::HasValidEntryPoint() const
    {
        if (this->IsWasmFunction() ||
            (!m_scriptContext->HadProfiled() &&
            !(this->m_scriptContext->IsScriptContextInDebugMode() && m_scriptContext->IsExceptionWrapperForBuiltInsEnabled())))
        {
            return this->HasValidNonProfileEntryPoint();
        }
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
        if (m_scriptContext->IsProfiling())
        {
            return this->HasValidProfileEntryPoint();
        }

        return this->HasValidNonProfileEntryPoint() || this->HasValidProfileEntryPoint();
#else
        return this->HasValidNonProfileEntryPoint();
#endif
    }